

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O0

bool cmIncludeCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  MessageType t;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  const_reference pvVar7;
  ulong uVar8;
  cmMakefile *pcVar9;
  pointer ppVar10;
  string *psVar11;
  cmGlobalGenerator *this;
  ostream *poVar12;
  PolicyID id;
  PolicyID id_00;
  string_view name;
  char *local_798;
  undefined1 local_5c0 [8];
  string m;
  undefined1 local_588 [7];
  bool readit;
  string local_568;
  string_view local_548;
  byte local_532;
  byte local_531;
  undefined1 local_530 [6];
  bool fileIsDirectory;
  bool fileDoesnotExist;
  string listFile;
  string local_4f0;
  MessageType local_4cc;
  undefined1 local_4c8 [4];
  MessageType messageType;
  ostringstream e;
  char *local_350;
  char *modal;
  cmGlobalGenerator *gg;
  string fname_abs;
  string local_300;
  PolicyStatus local_2dc;
  iterator iStack_2d8;
  PolicyStatus PolicyStatus;
  _Self local_2d0;
  iterator ModulePolicy;
  undefined1 local_2b8 [8];
  string mfile;
  string module;
  undefined1 local_270 [6];
  bool system;
  undefined1 local_250 [8];
  string errorText;
  string local_228;
  allocator<char> local_201;
  string local_200;
  int local_1e0;
  allocator<char> local_1d9;
  string local_1d8;
  uint local_1b4;
  undefined1 local_1b0 [4];
  uint i;
  string resultVarName;
  string fname;
  undefined1 local_168 [5];
  bool noPolicyScope;
  bool optional;
  allocator<char> local_141;
  key_type local_140;
  allocator<char> local_119;
  key_type local_118;
  allocator<char> local_f1;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  allocator<char> local_79;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if ((cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::DeprecatedModules_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::DeprecatedModules_abi_cxx11_), iVar3 != 0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
    ::map(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::DeprecatedModules_abi_cxx11_);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::~map,&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_);
  }
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
          ::empty(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::DeprecatedModules_abi_cxx11_);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Dart",&local_41);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_40);
    *pmVar5 = CMP0145;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Documentation",&local_79);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_78);
    *pmVar5 = CMP0106;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"FindCUDA",&local_a1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_a0);
    *pmVar5 = CMP0146;
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"FindDart",&local_c9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_c8);
    *pmVar5 = CMP0145;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"FindPythonInterp",&local_f1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_f0);
    *pmVar5 = CMP0148;
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"FindPythonLibs",&local_119);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_118);
    *pmVar5 = CMP0148;
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"WriteCompilerDetectionHeader",&local_141);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_140);
    *pmVar5 = CMP0120;
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)status_local);
  if ((bVar2) ||
     (sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local), 4 < sVar6)) {
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,
               "called with wrong number of arguments.  include() only takes one file.",
               (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    cmExecutionStatus::SetError(pcVar1,(string *)local_168);
    std::__cxx11::string::~string((string *)local_168);
    std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    args_local._7_1_ = 0;
    goto LAB_006d4132;
  }
  fname.field_2._M_local_buf[0xe] = '\0';
  fname.field_2._M_local_buf[0xd] = '\0';
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  std::__cxx11::string::string((string *)(resultVarName.field_2._M_local_buf + 8),(string *)pvVar7);
  std::__cxx11::string::string((string *)local_1b0);
  for (local_1b4 = 1; uVar8 = (ulong)local_1b4,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local), uVar8 < sVar6; local_1b4 = local_1b4 + 1) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,(ulong)local_1b4);
    bVar2 = std::operator==(pvVar7,"OPTIONAL");
    pcVar1 = local_20;
    if (bVar2) {
      if ((fname.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"called with invalid arguments: OPTIONAL used twice",
                   &local_1d9);
        cmExecutionStatus::SetError(pcVar1,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator(&local_1d9);
        args_local._7_1_ = 0;
        local_1e0 = 1;
        goto LAB_006d40fe;
      }
      fname.field_2._M_local_buf[0xe] = '\x01';
    }
    else {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(ulong)local_1b4);
      bVar2 = std::operator==(pvVar7,"RESULT_VARIABLE");
      if (bVar2) {
        uVar8 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar8 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,
                     "called with invalid arguments: only one result variable allowed",&local_201);
          cmExecutionStatus::SetError(pcVar1,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator(&local_201);
          args_local._7_1_ = 0;
          local_1e0 = 1;
          goto LAB_006d40fe;
        }
        local_1b4 = local_1b4 + 1;
        uVar8 = (ulong)local_1b4;
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
        pcVar1 = local_20;
        if (sVar6 <= uVar8) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"called with no value for RESULT_VARIABLE.",
                     (allocator<char> *)(errorText.field_2._M_local_buf + 0xf));
          cmExecutionStatus::SetError(pcVar1,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(errorText.field_2._M_local_buf + 0xf));
          args_local._7_1_ = 0;
          local_1e0 = 1;
          goto LAB_006d40fe;
        }
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_1b4);
        std::__cxx11::string::operator=((string *)local_1b0,(string *)pvVar7);
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_1b4);
        bVar2 = std::operator==(pvVar7,"NO_POLICY_SCOPE");
        if (bVar2) {
          fname.field_2._M_local_buf[0xd] = '\x01';
        }
        else if (1 < local_1b4) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_1b4);
          cmStrCat<char_const(&)[31],std::__cxx11::string_const&>
                    ((string *)local_250,(char (*) [31])"called with invalid argument: ",pvVar7);
          cmExecutionStatus::SetError(local_20,(string *)local_250);
          args_local._7_1_ = 0;
          local_1e0 = 1;
          std::__cxx11::string::~string((string *)local_250);
          goto LAB_006d40fe;
        }
      }
    }
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)((long)&resultVarName.field_2 + 8));
    if (!bVar2) {
      module.field_2._M_local_buf[0xe] = '\0';
      cmStrCat<std::__cxx11::string&,char_const(&)[7]>
                ((string *)((long)&mfile.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&resultVarName.field_2 + 8),(char (*) [7])0x11318a7);
      pcVar9 = cmExecutionStatus::GetMakefile(local_20);
      name = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)(mfile.field_2._M_local_buf + 8));
      ModulePolicy._M_node = (_Base_ptr)name._M_len;
      cmMakefile::GetModulesFile_abi_cxx11_
                ((string *)local_2b8,pcVar9,name,(bool *)(module.field_2._M_local_buf + 0xe));
      if ((module.field_2._M_local_buf[0xe] & 1U) != 0) {
        local_2d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::find(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                     ::DeprecatedModules_abi_cxx11_,(key_type *)((long)&resultVarName.field_2 + 8));
        iStack_2d8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                     ::end(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_);
        bVar2 = std::operator!=(&local_2d0,&stack0xfffffffffffffd28);
        if (bVar2) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                    ::operator->(&local_2d0);
          local_2dc = cmMakefile::GetPolicyStatus(pcVar9,ppVar10->second,false);
          if (local_2dc != OLD) {
            if (local_2dc == WARN) {
              pcVar9 = cmExecutionStatus::GetMakefile(local_20);
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                        ::operator->(&local_2d0);
              cmPolicies::GetPolicyWarning_abi_cxx11_
                        ((string *)((long)&fname_abs.field_2 + 8),
                         (cmPolicies *)(ulong)ppVar10->second,id);
              cmStrCat<std::__cxx11::string,char_const(&)[2]>
                        (&local_300,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fname_abs.field_2 + 8),(char (*) [2])0x1156636);
              cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,&local_300);
              std::__cxx11::string::~string((string *)&local_300);
              std::__cxx11::string::~string((string *)(fname_abs.field_2._M_local_buf + 8));
            }
            else if (local_2dc - NEW < 3) {
              std::__cxx11::string::operator=((string *)local_2b8,"");
            }
          }
        }
      }
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::operator=
                  ((string *)(resultVarName.field_2._M_local_buf + 8),(string *)local_2b8);
      }
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)(mfile.field_2._M_local_buf + 8));
    }
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar9);
    cmsys::SystemTools::CollapseFullPath
              ((string *)&gg,(string *)((long)&resultVarName.field_2 + 8),psVar11);
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    this = cmMakefile::GetGlobalGenerator(pcVar9);
    bVar2 = cmGlobalGenerator::IsExportedTargetsFile(this,(string *)&gg);
    if (bVar2) {
      local_350 = (char *)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
      local_4cc = AUTHOR_WARNING;
      pcVar9 = cmExecutionStatus::GetMakefile(local_20);
      PVar4 = cmMakefile::GetPolicyStatus(pcVar9,CMP0024,false);
      if (PVar4 != OLD) {
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_4f0,(cmPolicies *)0x18,id_00);
          poVar12 = std::operator<<((ostream *)local_4c8,(string *)&local_4f0);
          std::operator<<(poVar12,"\n");
          std::__cxx11::string::~string((string *)&local_4f0);
          local_350 = "should";
        }
        else if (PVar4 - NEW < 3) {
          local_350 = "may";
          local_4cc = FATAL_ERROR;
        }
      }
      if (local_350 == (char *)0x0) {
LAB_006d3cd0:
        cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
        cmGlobalGenerator::GenerateImportFile(this,(string *)&gg);
        local_1e0 = 0;
      }
      else {
        poVar12 = std::operator<<((ostream *)local_4c8,"The file\n  ");
        poVar12 = std::operator<<(poVar12,(string *)&gg);
        poVar12 = std::operator<<(poVar12,"\nwas generated by the export() command.  It ");
        poVar12 = std::operator<<(poVar12,local_350);
        std::operator<<(poVar12,
                        " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
                       );
        pcVar9 = cmExecutionStatus::GetMakefile(local_20);
        t = local_4cc;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar9,t,(string *)((long)&listFile.field_2 + 8));
        std::__cxx11::string::~string((string *)(listFile.field_2._M_local_buf + 8));
        if (local_4cc != FATAL_ERROR) goto LAB_006d3cd0;
        args_local._7_1_ = 0;
        local_1e0 = 1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
      if (local_1e0 == 0) goto LAB_006d3d2e;
    }
    else {
LAB_006d3d2e:
      pcVar9 = cmExecutionStatus::GetMakefile(local_20);
      psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar9);
      cmsys::SystemTools::CollapseFullPath
                ((string *)local_530,(string *)((long)&resultVarName.field_2 + 8),psVar11);
      bVar2 = cmsys::SystemTools::FileExists((string *)local_530);
      local_531 = ~bVar2 & 1;
      local_532 = cmsys::SystemTools::FileIsDirectory((string *)local_530);
      if (((local_531 & 1) != 0) || ((bool)local_532)) {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_548,"NOTFOUND");
          cmMakefile::AddDefinition(pcVar9,(string *)local_1b0,local_548);
        }
        pcVar1 = local_20;
        if ((fname.field_2._M_local_buf[0xe] & 1U) == 0) {
          if ((local_531 & 1) == 0) {
            if ((local_532 & 1) == 0) goto LAB_006d3f58;
            cmStrCat<char_const(&)[34],std::__cxx11::string&>
                      ((string *)local_588,(char (*) [34])"requested file is a directory:\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&resultVarName.field_2 + 8));
            cmExecutionStatus::SetError(pcVar1,(string *)local_588);
            std::__cxx11::string::~string((string *)local_588);
            args_local._7_1_ = 0;
            local_1e0 = 1;
          }
          else {
            cmStrCat<char_const(&)[34],std::__cxx11::string&>
                      (&local_568,(char (*) [34])"could not find requested file:\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&resultVarName.field_2 + 8));
            cmExecutionStatus::SetError(pcVar1,&local_568);
            std::__cxx11::string::~string((string *)&local_568);
            args_local._7_1_ = 0;
            local_1e0 = 1;
          }
        }
        else {
          args_local._7_1_ = 1;
          local_1e0 = 1;
        }
      }
      else {
LAB_006d3f58:
        pcVar9 = cmExecutionStatus::GetMakefile(local_20);
        bVar2 = cmMakefile::ReadDependentFile
                          (pcVar9,(string *)local_530,(bool)(fname.field_2._M_local_buf[0xd] & 1));
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          if (bVar2) {
            local_798 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_798 = "NOTFOUND";
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&m.field_2 + 8),
                     local_798);
          cmMakefile::AddDefinition(pcVar9,(string *)local_1b0,stack0xfffffffffffffa60);
        }
        if ((((fname.field_2._M_local_buf[0xe] & 1U) != 0) || (bVar2)) ||
           (bVar2 = cmSystemTools::GetFatalErrorOccurred(), bVar2)) {
          args_local._7_1_ = 1;
          local_1e0 = 1;
        }
        else {
          cmStrCat<char_const(&)[34],std::__cxx11::string&>
                    ((string *)local_5c0,(char (*) [34])"could not load requested file:\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&resultVarName.field_2 + 8));
          cmExecutionStatus::SetError(local_20,(string *)local_5c0);
          args_local._7_1_ = 0;
          local_1e0 = 1;
          std::__cxx11::string::~string((string *)local_5c0);
        }
      }
      std::__cxx11::string::~string((string *)local_530);
    }
    std::__cxx11::string::~string((string *)&gg);
  }
  else {
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_270,"include() given empty file name (ignored).",
               (allocator<char> *)(module.field_2._M_local_buf + 0xf));
    cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,(string *)local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::allocator<char>::~allocator((allocator<char> *)(module.field_2._M_local_buf + 0xf));
    args_local._7_1_ = 1;
    local_1e0 = 1;
  }
LAB_006d40fe:
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)(resultVarName.field_2._M_local_buf + 8));
LAB_006d4132:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmIncludeCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<std::string, cmPolicies::PolicyID> DeprecatedModules;
  if (DeprecatedModules.empty()) {
    DeprecatedModules["Dart"] = cmPolicies::CMP0145;
    DeprecatedModules["Documentation"] = cmPolicies::CMP0106;
    DeprecatedModules["FindCUDA"] = cmPolicies::CMP0146;
    DeprecatedModules["FindDart"] = cmPolicies::CMP0145;
    DeprecatedModules["FindPythonInterp"] = cmPolicies::CMP0148;
    DeprecatedModules["FindPythonLibs"] = cmPolicies::CMP0148;
    DeprecatedModules["WriteCompilerDetectionHeader"] = cmPolicies::CMP0120;
  }

  if (args.empty() || args.size() > 4) {
    status.SetError("called with wrong number of arguments.  "
                    "include() only takes one file.");
    return false;
  }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i = 1; i < args.size(); i++) {
    if (args[i] == "OPTIONAL") {
      if (optional) {
        status.SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
      }
      optional = true;
    } else if (args[i] == "RESULT_VARIABLE") {
      if (!resultVarName.empty()) {
        status.SetError("called with invalid arguments: "
                        "only one result variable allowed");
        return false;
      }
      if (++i < args.size()) {
        resultVarName = args[i];
      } else {
        status.SetError("called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "NO_POLICY_SCOPE") {
      noPolicyScope = true;
    } else if (i > 1) // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
    {
      std::string errorText =
        cmStrCat("called with invalid argument: ", args[i]);
      status.SetError(errorText);
      return false;
    }
  }

  if (fname.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::AUTHOR_WARNING,
      "include() given empty file name (ignored).");
    return true;
  }

  if (!cmSystemTools::FileIsFullPath(fname)) {
    bool system = false;
    // Not a path. Maybe module.
    std::string module = cmStrCat(fname, ".cmake");
    std::string mfile = status.GetMakefile().GetModulesFile(module, system);

    if (system) {
      auto ModulePolicy = DeprecatedModules.find(fname);
      if (ModulePolicy != DeprecatedModules.end()) {
        cmPolicies::PolicyStatus PolicyStatus =
          status.GetMakefile().GetPolicyStatus(ModulePolicy->second);
        switch (PolicyStatus) {
          case cmPolicies::WARN: {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(ModulePolicy->second),
                       "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            mfile = "";
            break;
        }
      }
    }

    if (!mfile.empty()) {
      fname = mfile;
    }
  }

  std::string fname_abs = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  cmGlobalGenerator* gg = status.GetMakefile().GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs)) {
    const char* modal = nullptr;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;

    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0024)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "The file\n  " << fname_abs
        << "\nwas generated by the export() "
           "command.  It "
        << modal
        << " not be used as the argument to the "
           "include() command.  Use ALIAS targets instead to refer to targets "
           "by alternative names.\n";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
  }

  std::string listFile = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  const bool fileDoesnotExist = !cmSystemTools::FileExists(listFile);
  const bool fileIsDirectory = cmSystemTools::FileIsDirectory(listFile);
  if (fileDoesnotExist || fileIsDirectory) {
    if (!resultVarName.empty()) {
      status.GetMakefile().AddDefinition(resultVarName, "NOTFOUND");
    }
    if (optional) {
      return true;
    }
    if (fileDoesnotExist) {
      status.SetError(cmStrCat("could not find requested file:\n  ", fname));
      return false;
    }
    if (fileIsDirectory) {
      status.SetError(cmStrCat("requested file is a directory:\n  ", fname));
      return false;
    }
  }

  bool readit =
    status.GetMakefile().ReadDependentFile(listFile, noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty()) {
    status.GetMakefile().AddDefinition(
      resultVarName, readit ? fname_abs.c_str() : "NOTFOUND");
  }

  if (!optional && !readit && !cmSystemTools::GetFatalErrorOccurred()) {
    std::string m = cmStrCat("could not load requested file:\n  ", fname);
    status.SetError(m);
    return false;
  }
  return true;
}